

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O0

void __thiscall QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(QPDFOutlineObjectHelper *this)

{
  QPDFOutlineObjectHelper *this_local;
  
  ~QPDFOutlineObjectHelper(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~QPDFOutlineObjectHelper() override
    {
        // This must be cleared explicitly to avoid circular references that prevent cleanup of
        // shared pointers.
        m->parent = nullptr;
    }